

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

void writedata(void)

{
  int iVar1;
  symboltype sVar2;
  datatype dVar3;
  int tabindex;
  char *__format;
  float fVar4;
  char label [10];
  
  fwrite("_DATA SEGMENT word public \'data\'\n",0x21,1,(FILE *)ofp);
  fwrite("TestResult     dw     ?\n",0x18,1,(FILE *)ofp);
  tabindex = 0x24;
  do {
    iVar1 = tablesize();
    if (iVar1 <= tabindex) {
      fwrite("_DATA ENDS\n\n",0xc,1,(FILE *)ofp);
      return;
    }
    sVar2 = symclass(tabindex);
    if (sVar2 == sttempvar) {
LAB_0010861b:
      iVar1 = getproc(tabindex);
      if (iVar1 != 0x23) goto LAB_00108649;
      getlabel(tabindex,label);
      dVar3 = data_class(tabindex);
      if (dVar3 == dtinteger) {
        __format = "%-10s     dw     ?\n";
      }
      else {
        __format = "%-10s     dd     ?\n";
      }
      fprintf((FILE *)ofp,__format,label);
    }
    else {
      sVar2 = symclass(tabindex);
      if (sVar2 == stvariable) goto LAB_0010861b;
LAB_00108649:
      sVar2 = symclass(tabindex);
      if (sVar2 == stliteral) {
        dVar3 = data_class(tabindex);
        if (dVar3 == dtreal) {
          getlabel(tabindex,label);
          fVar4 = getrvalue(tabindex);
          fprintf((FILE *)ofp,"%-10s     dd     %f\n",(double)fVar4,label);
        }
      }
    }
    tabindex = tabindex + 1;
  } while( true );
}

Assistant:

void    writedata(void)
{    
    fprintf(ofp, "_DATA SEGMENT word public \'data\'\n");
    fprintf(ofp, "TestResult     dw     ?\n");
    
    int    i;
    float    litvalue;
    char    label[LABELSIZE];
    
    for (i = NUMTOKENS+2; i < tablesize();  i++)    {
        if ((symclass(i) == sttempvar || symclass(i) == stvariable)
            && getproc(i) == NUMTOKENS+1)    {
            //printlexeme(i);
            //getchar();
            getlabel(i, label);
            if (data_class(i) == dtinteger)
                fprintf(ofp, "%-10s     dw     ?\n", label);
            else
                fprintf(ofp, "%-10s     dd     ?\n", label);
        }
        else if (symclass(i) == stliteral
                 && data_class(i) == dtreal)    {
            //printlexeme(i);
            //getchar();
            getlabel(i, label);
            litvalue = getrvalue(i);
            fprintf(ofp, "%-10s     dd     %f\n",
                    label, litvalue);
        }
    }
    
    fprintf(ofp, "_DATA ENDS\n\n");
}